

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv4Transmitter::LeaveAllMulticastGroups(RTPUDPv4Transmitter *this)

{
  uint uVar1;
  HashElement *pHVar2;
  RTPMemoryManager *pRVar3;
  HashElement *pHVar4;
  uint uVar5;
  ip_mreq mreq;
  uint local_30;
  uint local_2c;
  
  if ((this->init == true) && (this->created == true)) {
    pHVar4 = (this->multicastgroups).firsthashelem;
    (this->multicastgroups).curhashelem = pHVar4;
    if (pHVar4 == (HashElement *)0x0) {
      memset((this->multicastgroups).table,0,0x103e8);
    }
    else {
      do {
        uVar1 = pHVar4->element;
        uVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar1 = this->mcastifaceIP;
        local_2c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        local_30 = uVar5;
        setsockopt(this->rtpsock,0,0x24,&local_30,8);
        if (this->rtpsock != this->rtcpsock) {
          uVar1 = this->mcastifaceIP;
          local_2c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
          ;
          local_30 = uVar5;
          setsockopt(this->rtcpsock,0,0x24,&local_30,8);
        }
        pHVar4 = (this->multicastgroups).curhashelem;
        if (pHVar4 == (HashElement *)0x0) break;
        pHVar4 = pHVar4->listnext;
        (this->multicastgroups).curhashelem = pHVar4;
      } while (pHVar4 != (HashElement *)0x0);
      pHVar4 = (this->multicastgroups).firsthashelem;
      memset((this->multicastgroups).table,0,0x103e8);
      while (pHVar4 != (HashElement *)0x0) {
        pHVar2 = pHVar4->listnext;
        pRVar3 = (this->multicastgroups).super_RTPMemoryObject.mgr;
        if (pRVar3 == (RTPMemoryManager *)0x0) {
          operator_delete(pHVar4,0x28);
          pHVar4 = pHVar2;
        }
        else {
          (*pRVar3->_vptr_RTPMemoryManager[3])(pRVar3,pHVar4);
          pHVar4 = pHVar2;
        }
      }
    }
    (this->multicastgroups).firsthashelem = (HashElement *)0x0;
    (this->multicastgroups).lasthashelem = (HashElement *)0x0;
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			uint32_t mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			if (rtpsock != rtcpsock) // no need to leave multicast group twice when multiplexing
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			JRTPLIB_UNUSED(status);

			multicastgroups.GotoNextElement();
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}